

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O3

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::expression
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this,
          vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *code,int pcStart,int frame)

{
  _func_void__Op_any_ptr__Arg_ptr *p_Var1;
  SelectionSet *pSVar2;
  pointer pTVar3;
  long *plVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  _Elt_pointer pSVar8;
  uint uVar9;
  Token instruction;
  stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
  stack;
  undefined1 local_128 [32];
  SelectionSet local_108;
  SelectionSet local_e8;
  undefined1 local_d0 [16];
  _Storage local_c0;
  _Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> local_b8;
  NameFinder *local_60;
  vector<int,_std::allocator<int>_> *local_58;
  SelectionSet *local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_50 = __return_storage_ptr__;
  createSelectionSets(&local_108,this);
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::_M_initialize_map
            (&local_b8,0);
  uVar6 = (ulong)(uint)pcStart;
  pTVar3 = (code->super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = ((long)(code->super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pTVar3 >> 3) * -0x5555555555555555;
  if (uVar6 <= uVar7 && uVar7 - uVar6 != 0) {
    local_60 = &this->nameFinder;
    local_58 = &this->nObjects;
    uVar9 = pcStart + 1;
    do {
      uVar7._0_4_ = pTVar3[uVar6].tok;
      uVar7._4_4_ = pTVar3[uVar6].intValue;
      local_c0._M_ptr = (void *)0x0;
      p_Var1 = pTVar3[uVar6].value._M_manager;
      local_d0._0_8_ = uVar7;
      if (p_Var1 == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        local_d0._8_8_ = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      }
      else {
        local_128._0_8_ = local_d0 + 8;
        (*p_Var1)(2,&pTVar3[uVar6].value,(_Arg *)local_128);
        uVar7 = local_d0._0_8_ & 0xffffffff;
      }
      iVar5 = (int)uVar7;
      if (0x140b < iVar5) {
        if (iVar5 < 0x3400) {
          if (iVar5 == 0x140c) {
            hull((SelectionSet *)local_128,this,frame);
            std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::
            emplace_back<OpenMD::SelectionSet>
                      ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)
                       &local_b8,(SelectionSet *)local_128);
          }
          else {
            if (iVar5 != 0x140d) goto switchD_002621b7_caseD_406;
            alphaHullInstruction((SelectionSet *)local_128,this,(Token *)local_d0,frame);
            std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::
            emplace_back<OpenMD::SelectionSet>
                      ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)
                       &local_b8,(SelectionSet *)local_128);
          }
        }
        else if (iVar5 - 0x3400U < 6) {
          comparatorInstruction((SelectionSet *)local_128,this,(Token *)local_d0,frame);
          std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::
          emplace_back<OpenMD::SelectionSet>
                    ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)&local_b8
                     ,(SelectionSet *)local_128);
        }
        else {
          if (iVar5 != 0x10400) goto switchD_002621b7_caseD_406;
          indexInstruction((SelectionSet *)local_128,this,(any *)(local_d0 + 8));
          std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::
          emplace_back<OpenMD::SelectionSet>
                    ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)&local_b8
                     ,(SelectionSet *)local_128);
        }
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_128)
        ;
        goto LAB_00262277;
      }
      if (0x463 < iVar5) {
        if (1 < iVar5 - 0x464U) {
          if (iVar5 != 0x1406) goto switchD_002621b7_caseD_406;
          pSVar8 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pSVar8 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
          }
          withinInstruction(this,(Token *)local_d0,pSVar8 + -1,frame);
        }
        goto LAB_00262277;
      }
      switch(iVar5) {
      case 0x403:
        pSVar8 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pSVar8 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
        }
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator=
                  (&local_108.bitsets_,&pSVar8[-1].bitsets_);
        std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::pop_back
                  ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)&local_b8);
        pSVar8 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pSVar8 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
        }
        SelectionSet::andOperator(pSVar8 + -1,&local_108);
        break;
      case 0x404:
        pSVar8 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pSVar8 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
        }
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator=
                  (&local_108.bitsets_,&pSVar8[-1].bitsets_);
        std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::pop_back
                  ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)&local_b8);
        pSVar8 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pSVar8 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
        }
        SelectionSet::orOperator(pSVar8 + -1,&local_108);
        break;
      case 0x405:
        pSVar8 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pSVar8 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
        }
        SelectionSet::flip(pSVar8 + -1);
        break;
      case 0x409:
        allInstruction(&local_e8,this);
        local_128._16_8_ =
             local_108.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        local_128._8_8_ =
             local_108.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_finish;
        local_128._0_8_ =
             local_108.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
        local_108.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_e8.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        local_108.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_e8.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
        local_108.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_e8.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_finish;
        local_e8.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_128)
        ;
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_e8.bitsets_);
        goto LAB_0026258f;
      case 0x40a:
        std::vector<int,_std::allocator<int>_>::vector(&local_48,local_58);
        SelectionSet::SelectionSet(&local_e8,&local_48);
        local_128._16_8_ =
             local_108.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        local_128._8_8_ =
             local_108.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_finish;
        local_128._0_8_ =
             local_108.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
        local_108.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_e8.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        local_108.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_e8.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
        local_108.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_e8.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_finish;
        local_e8.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_128)
        ;
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_e8.bitsets_);
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
LAB_0026258f:
        std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::push_back
                  ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)&local_b8,
                   &local_108);
        break;
      case 0x40b:
        plVar4 = (long *)std::__any_caster<std::__cxx11::string>((any *)(local_d0 + 8));
        if (plVar4 == (long *)0x0) {
          std::__throw_bad_any_cast();
        }
        local_128._0_8_ = local_128 + 0x10;
        std::__cxx11::string::_M_construct<char*>((string *)local_128,*plVar4,plVar4[1] + *plVar4);
        NameFinder::match(&local_e8,local_60,(string *)local_128);
        std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::
        emplace_back<OpenMD::SelectionSet>
                  ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)&local_b8,
                   &local_e8);
LAB_002625fd:
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_e8.bitsets_);
        if ((pointer)local_128._0_8_ != (pointer)(local_128 + 0x10)) {
          operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
        }
        break;
      default:
        if (iVar5 == 1) {
          plVar4 = (long *)std::__any_caster<std::__cxx11::string>((any *)(local_d0 + 8));
          if (plVar4 == (long *)0x0) {
            std::__throw_bad_any_cast();
          }
          local_128._0_8_ = local_128 + 0x10;
          std::__cxx11::string::_M_construct<char*>((string *)local_128,*plVar4,plVar4[1] + *plVar4)
          ;
          lookupValue(&local_e8,this,(string *)local_128);
          std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::
          emplace_back<OpenMD::SelectionSet>
                    ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)&local_b8
                     ,&local_e8);
          goto LAB_002625fd;
        }
      case 0x406:
      case 0x407:
      case 0x408:
switchD_002621b7_caseD_406:
        unrecognizedExpression(this);
      }
LAB_00262277:
      if ((_func_void__Op_any_ptr__Arg_ptr *)local_d0._8_8_ !=
          (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        (*(code *)local_d0._8_8_)(_Op_destroy,(any *)(local_d0 + 8),(_Arg *)0x0);
      }
      uVar6 = (ulong)uVar9;
      pTVar3 = (code->super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = ((long)(code->super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 3) *
              -0x5555555555555555;
      uVar9 = uVar9 + 1;
    } while (uVar6 <= uVar7 && uVar7 - uVar6 != 0);
  }
  if (((long)local_b8._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)local_b8._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
      ((long)local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)local_b8._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555
      + (((long)local_b8._M_impl.super__Deque_impl_data._M_finish._M_node -
          (long)local_b8._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
        (ulong)(local_b8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
        0x15 != 1) {
    local_128._0_8_ = (pointer)(local_128 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"atom expression compiler error - stack over/underflow","");
    snprintf(painCave.errMsg,2000,"SelectionEvaluator Error: %s\n",local_128._0_8_);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    if ((pointer)local_128._0_8_ != (pointer)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
    }
  }
  pSVar2 = local_50;
  pSVar8 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pSVar8 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::vector
            (&local_50->bitsets_,&pSVar8[-1].bitsets_);
  std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::~deque
            ((deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)&local_b8);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_108.bitsets_);
  return pSVar2;
}

Assistant:

SelectionSet SelectionEvaluator::expression(const std::vector<Token>& code,
                                              int pcStart, int frame) {
    SelectionSet bs = createSelectionSets();
    std::stack<SelectionSet> stack;

    for (unsigned int pc = pcStart; pc < code.size(); ++pc) {
      Token instruction = code[pc];

      switch (instruction.tok) {
      case Token::expressionBegin:
        break;
      case Token::expressionEnd:
        break;
      case Token::all:
        bs = allInstruction();
        stack.push(bs);
        break;
      case Token::none:
        bs = SelectionSet(nObjects);
        stack.push(bs);
        break;
      case Token::opOr:
        bs = stack.top();
        stack.pop();
        stack.top() |= bs;
        break;
      case Token::opAnd:
        bs = stack.top();
        stack.pop();
        stack.top() &= bs;
        break;
      case Token::opNot:
        stack.top().flip();
        break;
      case Token::within:
        withinInstruction(instruction, stack.top(), frame);
        break;
      case Token::alphahull:
        stack.push(alphaHullInstruction(instruction, frame));
        break;
      case Token::hull:
        stack.push(hull(frame));
        break;
        // case Token::selected:
        //  stack.push(getSelectionSet());
        //  break;
      case Token::name:
        stack.push(
            nameInstruction(std::any_cast<std::string>(instruction.value)));
        break;
      case Token::index:
        stack.push(indexInstruction(instruction.value));
        break;
      case Token::identifier:
        stack.push(lookupValue(std::any_cast<std::string>(instruction.value)));
        break;
      case Token::opLT:
      case Token::opLE:
      case Token::opGE:
      case Token::opGT:
      case Token::opEQ:
      case Token::opNE:
        stack.push(comparatorInstruction(instruction, frame));
        break;
      default:
        unrecognizedExpression();
      }
    }
    if (stack.size() != 1)
      evalError("atom expression compiler error - stack over/underflow");

    return stack.top();
  }